

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O3

void GetPredefinedCommands(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  pointer *pppcVar1;
  pointer *pppcVar2;
  cmExportCommand *this;
  iterator iVar3;
  cmExportCommand *local_18;
  
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6860
  ;
  iVar3._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c68e8
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6970
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c69f8
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6a80
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  this = (cmExportCommand *)operator_new(800);
  cmExportCommand::cmExportCommand(this);
  iVar3._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = this;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)this;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmExportLibraryDependenciesCommand_005c6b20;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x88);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmFLTKWrapUICommand_005c6ba8;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Targets).super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore;
  (local_18->Targets).super_cmCommandArgument.Key = (char *)0x0;
  *(undefined1 *)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl = 0;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6c30
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0xa0);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmInstallProgramsCommand_005c6cb8;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Targets).super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore;
  (local_18->Targets).super_cmCommandArgument.Key = (char *)0x0;
  *(undefined1 *)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl = 0;
  *(_Base_ptr *)
   ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 0x10) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 0x18) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 0x20) =
       (_Base_ptr)0x0;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6d40
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0xa0);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmLoadCacheCommand_005c6dc8;
  pppcVar2 = &(local_18->ArgumentGroup).ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Targets).super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)pppcVar2;
  (local_18->Targets).super_cmCommandArgument.Key = (char *)pppcVar2;
  *(undefined8 *)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl = 0;
  *(_Base_ptr **)
   &((_Rb_tree_header *)
    ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 8))->
    _M_header = (_Base_ptr *)
                ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl +
                0x18);
  *(_Base_ptr *)
   ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 0x10) =
       (_Base_ptr)0x0;
  *(undefined1 *)
   ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 0x18) = 0;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x90);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmOutputRequiredFilesCommand_005c6e50;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->Targets).super_cmCommandArgument.Key =
       (char *)((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 8)
  ;
  *(undefined8 *)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl = 0;
  *(undefined1 *)
   &(((_Rb_tree_header *)
     ((long)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl + 8))->
    _M_header)._M_color = _S_red;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6ed8
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6f60
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c6fe8
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7070
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c70f8
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7180
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_005c7208;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_005c72b8;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_005c7368;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_005c7418;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x78);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&(local_18->ArgumentGroup).ContainedArguments.
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_005c74c8;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7578
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7600
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7688
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x80);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmVariableWatchCommand_005c66d0;
  pppcVar2 = &(local_18->ArgumentGroup).ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(local_18->ArgumentGroup).ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  (local_18->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->Targets).super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)pppcVar2;
  (local_18->Targets).super_cmCommandArgument.Key = (char *)pppcVar2;
  *(undefined8 *)&(local_18->Targets).super_cmCommandArgument.ArgumentsBefore._M_t._M_impl = 0;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c7728
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    iVar3._M_current =
         (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_18 = (cmExportCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005c77b0
  ;
  if (iVar3._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar3,
               (cmCommand **)&local_18);
  }
  else {
    *iVar3._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void GetPredefinedCommands(std::vector<cmCommand*>& commands)
{
commands.push_back(new cmAddCompileOptionsCommand);
commands.push_back(new cmAuxSourceDirectoryCommand);
commands.push_back(new cmBuildNameCommand);
commands.push_back(new cmCMakeHostSystemInformationCommand);
commands.push_back(new cmElseIfCommand);
commands.push_back(new cmExportCommand);
commands.push_back(new cmExportLibraryDependenciesCommand);
commands.push_back(new cmFLTKWrapUICommand);
commands.push_back(new cmIncludeExternalMSProjectCommand);
commands.push_back(new cmInstallProgramsCommand);
commands.push_back(new cmLinkLibrariesCommand);
commands.push_back(new cmLoadCacheCommand);
commands.push_back(new cmOutputRequiredFilesCommand);
commands.push_back(new cmQTWrapCPPCommand);
commands.push_back(new cmQTWrapUICommand);
commands.push_back(new cmRemoveCommand);
commands.push_back(new cmRemoveDefinitionsCommand);
commands.push_back(new cmSourceGroupCommand);
commands.push_back(new cmSubdirDependsCommand);
commands.push_back(new cmTargetCompileDefinitionsCommand);
commands.push_back(new cmTargetCompileFeaturesCommand);
commands.push_back(new cmTargetCompileOptionsCommand);
commands.push_back(new cmTargetIncludeDirectoriesCommand);
commands.push_back(new cmTargetSourcesCommand);
commands.push_back(new cmUseMangledMesaCommand);
commands.push_back(new cmUtilitySourceCommand);
commands.push_back(new cmVariableRequiresCommand);
commands.push_back(new cmVariableWatchCommand);
commands.push_back(new cmWriteFileCommand);
commands.push_back(new cmLoadCommandCommand);

}